

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O3

void __thiscall wasm::RandomLattice::RandomLattice(RandomLattice *this,Random *rand,size_t depth)

{
  RandomFullLattice *pRVar1;
  uint32_t uVar2;
  pointer pLVar3;
  unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  *this_00;
  pointer __p;
  __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  local_b0;
  RandomFullLattice local_a8;
  RandomFullLattice local_98;
  RandomLattice local_88;
  undefined4 local_78;
  _Variadic_union<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
  local_70;
  undefined1 local_48;
  RandomLattice local_40;
  
  this->rand = rand;
  (this->lattice)._M_t.
  super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
       (LatticeImpl *)0x0;
  this_00 = &this->lattice;
  uVar2 = Random::upTo(rand,0xd);
  if (uVar2 < 7) {
    RandomFullLattice::RandomFullLattice
              (&local_98,rand,depth,(optional<unsigned_int>)((ulong)uVar2 | 0x100000000));
    local_70._0_8_ = local_98.rand;
    local_70._8_8_ =
         local_98.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl;
    local_98.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
            )0x0;
    local_48 = 0;
    pLVar3 = (pointer)operator_new(0x30);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                       *)pLVar3,
                      (_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                       *)&local_70._M_first);
    local_40.rand = (Random *)0x0;
    std::
    __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             *)this_00,pLVar3);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)&local_40);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                         *)&local_70._M_first);
    std::
    unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ::~unique_ptr(&local_98.lattice);
    return;
  }
  switch(uVar2) {
  case 7:
    local_48 = 1;
    pLVar3 = (pointer)operator_new(0x30);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                       *)pLVar3,
                      (_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                       *)&local_70._M_first);
    local_98.rand = (Random *)0x0;
    std::
    __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             *)this_00,pLVar3);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)&local_98);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                         *)&local_70._M_first);
    return;
  case 8:
    RandomLattice(&local_40,rand,depth + 1);
    local_70._8_8_ = local_40.lattice;
    local_98.rand = local_40.rand;
    local_40.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_70._0_8_ = local_40.rand;
    local_98.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
            )0x0;
    local_48 = 2;
    pLVar3 = (pointer)operator_new(0x30);
    break;
  case 9:
    RandomLattice(&local_40,rand,depth + 1);
    local_70._8_8_ = local_40.lattice;
    local_98.rand = local_40.rand;
    local_40.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_70._0_8_ = local_40.rand;
    local_98.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
            )0x0;
    local_48 = 3;
    pLVar3 = (pointer)operator_new(0x30);
    break;
  case 10:
    RandomLattice(&local_40,rand,depth + 1);
    uVar2 = Random::upTo(rand,4);
    local_70._8_8_ =
         local_40.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
    local_88.rand = (Random *)(ulong)uVar2;
    pRVar1 = &local_98;
    local_98.rand = local_40.rand;
    local_40.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_70._0_8_ = local_40.rand;
    local_98.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
            )0x0;
    local_48 = 4;
    local_70._16_8_ = local_88.rand;
    pLVar3 = (pointer)operator_new(0x30);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                       *)pLVar3,
                      (_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                       *)&local_70._M_first);
    local_a8.rand = (Random *)0x0;
    std::
    __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             *)this_00,pLVar3);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)&local_a8);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                         *)&local_70._M_first);
    goto LAB_00196ed9;
  case 0xb:
    RandomLattice(&local_40,rand,depth + 1);
    RandomLattice((RandomLattice *)&local_a8,rand,depth + 1);
    local_70._24_8_ =
         local_40.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
    local_70._8_8_ = local_a8.lattice;
    local_98.rand = local_a8.rand;
    local_a8.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
            )0x0;
    local_88.rand = local_40.rand;
    local_40.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_70._0_8_ = local_a8.rand;
    local_98.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
            )0x0;
    local_70._16_8_ = local_40.rand;
    local_88.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_48 = 5;
    pLVar3 = (pointer)operator_new(0x30);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                       *)pLVar3,
                      (_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                       *)&local_70._M_first);
    local_b0._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (tuple<wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
          )(_Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    std::
    __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             *)this_00,pLVar3);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)&local_b0);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                         *)&local_70._M_first);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr(&local_88.lattice);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)&local_98.lattice);
    pRVar1 = &local_a8;
LAB_00196ed9:
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)&pRVar1->lattice);
    goto LAB_00197042;
  case 0xc:
    RandomLattice(&local_40,rand,depth + 1);
    local_98.rand = local_40.rand;
    local_98.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_data<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>,_true,_true>
            )local_40.lattice._M_t.
             super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
    local_40.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    getBottom(&local_88);
    local_70._8_8_ =
         local_98.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl;
    local_78 = 0;
    local_70._0_8_ = local_98.rand;
    local_98.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomFullLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
            )0x0;
    local_70._16_8_ = local_88.rand;
    local_70._24_8_ =
         local_88.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
    local_88.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_70._32_4_ = 0;
    local_48 = 6;
    pLVar3 = (pointer)operator_new(0x30);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                       *)pLVar3,
                      (_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                       *)&local_70._M_first);
    local_a8.rand = (Random *)0x0;
    std::
    __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             *)this_00,pLVar3);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)&local_a8);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                         *)&local_70._M_first);
    if (local_88.lattice._M_t.
        super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         )0x0) {
      (*(code *)local_88.rand)();
    }
    local_88.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    goto LAB_0019703a;
  default:
    wasm::handle_unreachable
              ("unexpected pick",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
               ,0x115);
  }
  std::__detail::__variant::
  _Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                     *)pLVar3,
                    (_Move_ctor_base<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                     *)&local_70._M_first);
  local_a8.rand = (Random *)0x0;
  std::
  __uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  ::reset((__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
           *)this_00,pLVar3);
  std::
  unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                 *)&local_a8);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
  ::~_Variant_storage((_Variant_storage<false,_wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                       *)&local_70._M_first);
LAB_0019703a:
  std::
  unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                 *)&local_98.lattice);
LAB_00197042:
  std::
  unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  ::~unique_ptr(&local_40.lattice);
  return;
}

Assistant:

RandomLattice::RandomLattice(Random& rand, size_t depth) : rand(rand) {
  // TODO: Limit the depth once we get lattices with more fan-out.
  uint32_t pick = rand.upTo(FullLatticePicks + 6);

  if (pick < FullLatticePicks) {
    lattice = std::make_unique<LatticeImpl>(
      LatticeImpl{RandomFullLattice{rand, depth, pick}});
    return;
  }

  switch (pick) {
    case FullLatticePicks + 0:
      lattice = std::make_unique<LatticeImpl>(LatticeImpl{Flat<uint32_t>{}});
      return;
    case FullLatticePicks + 1:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{Lift{RandomLattice{rand, depth + 1}}});
      return;
    case FullLatticePicks + 2:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{ArrayLattice{RandomLattice{rand, depth + 1}}});
      return;
    case FullLatticePicks + 3:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{Vector{RandomLattice{rand, depth + 1}, rand.upTo(4)}});
      return;
    case FullLatticePicks + 4:
      lattice = std::make_unique<LatticeImpl>(LatticeImpl{TupleLattice{
        RandomLattice{rand, depth + 1}, RandomLattice{rand, depth + 1}}});
      return;
    case FullLatticePicks + 5:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{SharedPath{RandomLattice{rand, depth + 1}}});
      return;
  }
  WASM_UNREACHABLE("unexpected pick");
}